

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateZeroInitialize(ExpressionEvalContext *ctx,ExprZeroInitialize *expression)

{
  TypeBase *pTVar1;
  _func_int **__s;
  Allocator *pAVar2;
  SynBase *pSVar3;
  bool bVar4;
  int iVar5;
  ExprBase *pEVar6;
  undefined4 extraout_var;
  size_t __n;
  
  bVar4 = AddInstruction(ctx);
  if (bVar4) {
    pTVar1 = expression->address->type;
    if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x6f9,
                    "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                   );
    }
    pEVar6 = Evaluate(ctx,expression->address);
    if ((pEVar6 != (ExprBase *)0x0) && (pEVar6->typeID == 0xc)) {
      __s = pEVar6[1]._vptr_ExprBase;
      if (__s == (_func_int **)0x0) {
        __assert_fail("ptr->ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x700,
                      "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                     );
      }
      __n = *(long *)&pEVar6[1].typeID - (long)__s;
      if (__n == *(uint *)(pTVar1[1]._vptr_TypeBase + 6)) {
        memset(__s,0,__n);
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar1 = ctx->ctx->typeVoid;
        pEVar6->typeID = 2;
        pEVar6->source = pSVar3;
        pEVar6->type = pTVar1;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
        pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
        return pEVar6;
      }
      __assert_fail("uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x701,
                    "ExprBase *EvaluateZeroInitialize(ExpressionEvalContext &, ExprZeroInitialize *)"
                   );
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateZeroInitialize(ExpressionEvalContext &ctx, ExprZeroInitialize *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->address));

	if(!ptr)
		return NULL;

	assert(ptr->ptr);
	assert(uintptr_t(ptr->end - ptr->ptr) == unsigned(refType->subType->size));

	memset(ptr->ptr, 0, unsigned(refType->subType->size));

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}